

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  Module *pMVar1;
  pointer ppDVar2;
  DataSegment *pDVar3;
  pointer pNVar4;
  long lVar5;
  Opcode opc_00;
  bool bVar6;
  reference e;
  OpcodeExpr<(wabt::ExprType)7> *pOVar7;
  ConstExpr *pCVar8;
  Type t;
  pointer ppDVar9;
  undefined4 in_register_00000084;
  uint64_t dat_base;
  uint64_t abs_base;
  Opcode local_d4;
  Value *local_d0;
  Value ival;
  string index;
  string local_78;
  string access;
  
  local_d4.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_(&access,&this->lst,offset,addr_exp);
  if ((access._M_string_length == 0) || (bVar6 = std::operator==(&access,"*"), bVar6)) {
    bVar6 = ConstIntVal(this,addr_exp->e,&abs_base);
    if (bVar6) {
      abs_base = abs_base + offset;
      pMVar1 = (this->mc).module;
      ppDVar2 = (pMVar1->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_d0 = val;
      for (ppDVar9 = (pMVar1->data_segments).
                     super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; val = local_d0, ppDVar9 != ppDVar2;
          ppDVar9 = ppDVar9 + 1) {
        pDVar3 = *ppDVar9;
        if ((pDVar3->offset).size_ == 1) {
          e = intrusive_list<wabt::Expr>::front(&pDVar3->offset);
          bVar6 = ConstIntVal(this,e,&dat_base);
          if (((bVar6) && (dat_base <= abs_base)) &&
             (abs_base <
              (pDVar3->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              (dat_base -
              (long)(pDVar3->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start))) {
            std::__cxx11::string::string((string *)&ival,(string *)&pDVar3->name);
            local_78._M_dataplus._M_p = (pointer)0x0;
            local_78._M_string_length = 0;
            local_78.field_2._M_allocated_capacity = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_78,&ival,&index);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&index,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
            index.field_2._8_4_ = 10;
            Value::operator=(local_d0,(Value *)&index);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&index);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
            std::__cxx11::string::_M_dispose();
            offset = abs_base - dat_base;
          }
        }
      }
    }
    if (offset % align == 0) {
      std::__cxx11::to_string(&index,offset / align);
    }
    else {
      std::__cxx11::to_string((string *)&ival,offset);
      std::__cxx11::to_string(&local_78,align);
      cat<std::__cxx11::string,char[2],std::__cxx11::string>
                (&index,(wabt *)&ival,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d8cb4,
                 (char (*) [2])&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,opc.enum_));
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if (((((addr_exp->etype == Binary) &&
          (pOVar7 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(addr_exp->e),
          (pOVar7->opcode).enum_ == I32Add)) &&
         ((pNVar4 = (addr_exp->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start, pNVar4[1].etype == Binary &&
          ((pOVar7 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(pNVar4[1].e),
           (pOVar7->opcode).enum_ == I32Shl &&
           (lVar5 = *(long *)&pNVar4[1].children.
                              super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                              super__Vector_impl_data, *(int *)(lVar5 + 0x34) == 0x11)))))) &&
        (pCVar8 = cast<wabt::ConstExpr,wabt::Expr>(*(Expr **)(lVar5 + 0x38)),
        (pCVar8->const_).type_.enum_ == I32)) &&
       (1L << ((pCVar8->const_).data_.v[0] & 0x3f) == align)) {
      DecompileExpr(&ival,this,
                    pNVar4[1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start,pNVar4 + 1);
      if ((long)ival.v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)ival.v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        if (offset == 0) {
          std::__cxx11::string::_M_assign((string *)&index);
        }
        else {
          BracketIfNeeded(this,&ival,Add);
          cat<std::__cxx11::string,char[4],std::__cxx11::string>
                    (&local_78,
                     (wabt *)ival.v.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                     (char (*) [4])&index,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_00000084,opc.enum_));
          std::__cxx11::string::operator=((string *)&index,(string *)&local_78);
          std::__cxx11::string::_M_dispose();
        }
        DecompileExpr((Value *)&local_78,this,
                      (addr_exp->children).
                      super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                      super__Vector_impl_data._M_start,addr_exp);
        Value::operator=(val,(Value *)&local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_78);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ival.v);
    }
    BracketIfNeeded(this,val,Indexing);
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)&ival,(wabt *)0x1c6f8a,(char (*) [2])&index,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e8c9a,
               (char (*) [2])CONCAT44(in_register_00000084,opc.enum_));
    std::__cxx11::string::append
              ((string *)
               ((val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::__cxx11::string::_M_dispose();
    opc_00.enum_ = local_d4.enum_;
    if (access._M_string_length == 0) {
      t = GetMemoryType(op_type,local_d4);
      dat_base = (uint64_t)GetDecompTypeName(t);
      LoadStoreTracking::GenAlign_abi_cxx11_(&local_78,&this->lst,align,opc_00);
      cat<char[2],char_const*,std::__cxx11::string>
                ((string *)&ival,(wabt *)":",(char (*) [2])&dat_base,(char **)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,opc.enum_));
      std::__cxx11::string::append
                ((string *)
                 ((val->v).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1));
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    val->precedence = Indexing;
  }
  else {
    BracketIfNeeded(this,val,Indexing);
    std::operator+(&index,".",&access);
    std::__cxx11::string::append
              ((string *)
               ((val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void LoadStore(Value& val,
                 const Node& addr_exp,
                 uint64_t offset,
                 Opcode opc,
                 Address align,
                 Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base && abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value{{dat->name}, Precedence::Atomic};
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                     ? std::to_string(offset / align)
                     : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add && shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl && const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() += cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
                          lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }